

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaTrie.hpp
# Opt level: O1

uint32_t __thiscall
ddd::DaTrie<true,_false,_false>::xcheck_
          (DaTrie<true,_false,_false> *this,Edge *edge,uint32_t ng_block,
          vector<ddd::BlockLink,_std::allocator<ddd::BlockLink>_> *blocks)

{
  uint32_t uVar1;
  uint32_t block_pos;
  
  block_pos = this->head_pos_;
  if (block_pos != 0xffffffff) {
    do {
      if ((block_pos != ng_block) &&
         (uVar1 = xcheck_in_block_(this,edge,block_pos,blocks), uVar1 != 0xffffffff)) {
        return uVar1;
      }
      block_pos = (blocks->super__Vector_base<ddd::BlockLink,_std::allocator<ddd::BlockLink>_>).
                  _M_impl.super__Vector_impl_data._M_start[block_pos].next;
    } while (block_pos != this->head_pos_);
  }
  return (uint)edge->labels_[0] ^
         (uint)((ulong)((long)(this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>.
                             _M_impl.super__Vector_impl_data._M_start) >> 3);
}

Assistant:

uint32_t xcheck_(const Edge& edge, const uint32_t ng_block,
                   const std::vector<BlockLink>& blocks) const {
    assert(0 < edge.size());

    if (head_pos_ == NOT_FOUND) {
      return bc_size() ^ *edge.begin();
    }

    auto block_pos = head_pos_;
    do {
      if (block_pos == ng_block) {
        continue;
      }
      auto base = xcheck_in_block_(edge, block_pos, blocks);
      if (base != NOT_FOUND) {
        return base;
      }
    } while ((block_pos = blocks[block_pos].next) != head_pos_);

    return bc_size() ^ *edge.begin();
  }